

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_stdcxx.h
# Opt level: O0

uint32_t leveldb::port::AcceleratedCRC32C(uint32_t crc,char *buf,size_t size)

{
  size_t size_local;
  char *buf_local;
  uint32_t crc_local;
  
  return 0;
}

Assistant:

inline uint32_t AcceleratedCRC32C(uint32_t crc, const char* buf, size_t size) {
#if HAVE_CRC32C
  return ::crc32c::Extend(crc, reinterpret_cast<const uint8_t*>(buf), size);
#else
  // Silence compiler warnings about unused arguments.
  (void)crc;
  (void)buf;
  (void)size;
  return 0;
#endif  // HAVE_CRC32C
}